

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base
          (any_executor_base *this,any_executor_base *other)

{
  object_fns *poVar1;
  target_fns *ptVar2;
  long in_RSI;
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RSI + 0x28);
  poVar1 = object_fns_table<void>((type *)0x0);
  *(object_fns **)(in_RSI + 0x18) = poVar1;
  ptVar2 = target_fns_table<void>((type *)0x0);
  *(target_fns **)(in_RSI + 0x28) = ptVar2;
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI,in_RSI);
  *(undefined8 *)(in_RSI + 0x20) = 0;
  return;
}

Assistant:

any_executor_base(any_executor_base&& other) ASIO_NOEXCEPT
    : object_fns_(other.object_fns_),
      target_fns_(other.target_fns_)
  {
    other.object_fns_ = object_fns_table<void>();
    other.target_fns_ = target_fns_table<void>();
    object_fns_->move(*this, other);
    other.target_ = 0;
  }